

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

bool __thiscall QUrl::matches(QUrl *this,QUrl *url,FormattingOptions options)

{
  QUrlPrivate *this_00;
  QUrlPrivate *pQVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d;
  pQVar1 = url->d;
  bVar5 = true;
  if (this_00 == (QUrlPrivate *)0x0 && pQVar1 == (QUrlPrivate *)0x0) {
LAB_00240dc6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return bVar5;
    }
  }
  else {
    if (this_00 == (QUrlPrivate *)0x0) {
      lVar2 = *(long *)(in_FS_OFFSET + 0x28);
      this_00 = pQVar1;
    }
    else {
      if (pQVar1 != (QUrlPrivate *)0x0) {
        cVar3 = ((this_00->flags & 1) == 0) * '\b';
        bVar6 = cVar3 - 9;
        if ((options.i & 1U) == 0) {
          bVar4 = ::operator!=(&this_00->scheme,&pQVar1->scheme);
          if (!bVar4) goto LAB_00240cd2;
        }
        else {
          bVar6 = cVar3 - 10;
LAB_00240cd2:
          if ((options.i & 2U) == 0) {
            bVar4 = ::operator!=(&this->d->password,&url->d->password);
            if (bVar4) goto LAB_00240dc4;
          }
          else {
            bVar6 = bVar6 & 0xfb;
          }
          if ((~options.i & 6U) == 0) {
            bVar6 = bVar6 & 0xfd;
          }
          else {
            bVar4 = ::operator!=(&this->d->userName,&url->d->userName);
            if (bVar4) goto LAB_00240dc4;
          }
          if ((options.i & 8U) == 0) {
            if (this->d->port != url->d->port) goto LAB_00240dc4;
          }
          else {
            bVar6 = bVar6 & 0xef;
          }
          if ((~options.i & 0x1eU) == 0) {
            bVar6 = bVar6 & 0xf7;
          }
          else {
            bVar4 = ::operator!=(&this->d->host,&url->d->host);
            if (bVar4) goto LAB_00240dc4;
          }
          if ((options.i & 0x40U) == 0) {
            bVar4 = ::operator!=(&this->d->query,&url->d->query);
            if (bVar4) goto LAB_00240dc4;
          }
          else {
            bVar6 = bVar6 & 0xbf;
          }
          if ((char)options.i < '\0') {
            bVar6 = bVar6 & 0x7f;
          }
          else {
            bVar4 = ::operator!=(&this->d->fragment,&url->d->fragment);
            if (bVar4) goto LAB_00240dc4;
          }
          if ((bVar6 & (url->d->sectionIsPresent ^ this->d->sectionIsPresent)) == 0) {
            if ((options.i & 0x20U) == 0) {
              local_58.d = (Data *)0x0;
              local_58.ptr = (char16_t *)0x0;
              local_58.size = 0;
              QUrlPrivate::appendPath(this->d,(QString *)&local_58,options,Path);
              local_78.d = (Data *)0x0;
              local_78.ptr = (char16_t *)0x0;
              local_78.size = 0;
              QUrlPrivate::appendPath(url->d,(QString *)&local_78,options,Path);
              bVar5 = ::comparesEqual((QString *)&local_58,(QString *)&local_78);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            }
            goto LAB_00240dc6;
          }
        }
LAB_00240dc4:
        bVar5 = false;
        goto LAB_00240dc6;
      }
      lVar2 = *(long *)(in_FS_OFFSET + 0x28);
    }
    if (lVar2 == local_38) {
      bVar5 = QUrlPrivate::isEmpty(this_00);
      return bVar5;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QUrl::matches(const QUrl &url, FormattingOptions options) const
{
    if (!d && !url.d)
        return true;
    if (!d)
        return url.d->isEmpty();
    if (!url.d)
        return d->isEmpty();

    // First, compare which sections are present, since it speeds up the
    // processing considerably. We just have to ignore the host-is-present flag
    // for local files (the "file" protocol), due to the requirements of the
    // XDG file URI specification.
    int mask = QUrlPrivate::FullUrl;
    if (isLocalFile())
        mask &= ~QUrlPrivate::Host;

    if (options.testFlag(QUrl::RemoveScheme))
        mask &= ~QUrlPrivate::Scheme;
    else if (d->scheme != url.d->scheme)
        return false;

    if (options.testFlag(QUrl::RemovePassword))
        mask &= ~QUrlPrivate::Password;
    else if (d->password != url.d->password)
        return false;

    if (options.testFlag(QUrl::RemoveUserInfo))
        mask &= ~QUrlPrivate::UserName;
    else if (d->userName != url.d->userName)
        return false;

    if (options.testFlag(QUrl::RemovePort))
        mask &= ~QUrlPrivate::Port;
    else if (d->port != url.d->port)
        return false;

    if (options.testFlag(QUrl::RemoveAuthority))
        mask &= ~QUrlPrivate::Host;
    else if (d->host != url.d->host)
        return false;

    if (options.testFlag(QUrl::RemoveQuery))
        mask &= ~QUrlPrivate::Query;
    else if (d->query != url.d->query)
        return false;

    if (options.testFlag(QUrl::RemoveFragment))
        mask &= ~QUrlPrivate::Fragment;
    else if (d->fragment != url.d->fragment)
        return false;

    if ((d->sectionIsPresent & mask) != (url.d->sectionIsPresent & mask))
        return false;

    if (options.testFlag(QUrl::RemovePath))
        return true;

    // Compare paths, after applying path-related options
    QString path1;
    d->appendPath(path1, options, QUrlPrivate::Path);
    QString path2;
    url.d->appendPath(path2, options, QUrlPrivate::Path);
    return path1 == path2;
}